

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O3

JSONNode * __thiscall jsonChildren::operator[](jsonChildren *this,json_index_t position)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  JSONNode **ppJVar3;
  json_string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Children is null []","");
  JSONDebug::_JSON_ASSERT(true,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  uVar2 = this->mysize;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Using [] out of bounds","");
  JSONDebug::_JSON_ASSERT(position < uVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  uVar2 = this->mycapacity;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Using [] out of bounds","");
  JSONDebug::_JSON_ASSERT(position < uVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  ppJVar3 = this->array;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Array is null","");
  JSONDebug::_JSON_ASSERT(ppJVar3 != (JSONNode **)0x0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return this->array[position];
}

Assistant:

inline JSONNode * operator[] (json_index_t position) const json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null []"));
	   JSON_ASSERT(position < mysize, JSON_TEXT("Using [] out of bounds"));
	   JSON_ASSERT(position < mycapacity, JSON_TEXT("Using [] out of bounds"));
	   JSON_ASSERT(array != 0, JSON_TEXT("Array is null"));
	   return array[position];
    }